

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

string * __thiscall
spirv_cross::
join<char_const*&,char_const(&)[6],char_const*&,char_const(&)[5],char_const*&,char_const(&)[4]>
          (string *__return_storage_ptr__,spirv_cross *this,char **ts,char (*ts_1) [6],char **ts_2,
          char (*ts_3) [5],char **ts_4,char (*ts_5) [4])

{
  StringStream<4096UL,_4096UL> stream;
  StringStream<4096UL,_4096UL> local_1120;
  
  StringStream<4096UL,_4096UL>::StringStream(&local_1120);
  inner::
  join_helper<char_const*&,char_const(&)[6],char_const*&,char_const(&)[5],char_const*&,char_const(&)[4]>
            (&local_1120,(char **)this,(char (*) [6])ts,(char **)ts_1,(char (*) [5])ts_2,
             (char **)ts_3,(char (*) [4])ts_4);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)&local_1120);
  StringStream<4096UL,_4096UL>::~StringStream(&local_1120);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}